

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_treeops.c
# Opt level: O2

nbt_node * nbt_filter(nbt_node *tree,nbt_predicate_t filter,void *aux)

{
  undefined8 uVar1;
  _Bool _Var2;
  int *piVar3;
  nbt_node *__ptr;
  char *__ptr_00;
  nbt_list *pnVar4;
  uchar *__dest;
  size_t __n;
  size_t __size;
  
  if (filter == (nbt_predicate_t)0x0) {
    __assert_fail("filter",
                  "/workspace/llm4binary/github/license_c_cmakelists/chmod222[P]cNBT/nbt_treeops.c",
                  0x10c,"nbt_node *nbt_filter(const nbt_node *, nbt_predicate_t, void *)");
  }
  piVar3 = __errno_location();
  *piVar3 = 0;
  if ((tree == (nbt_node *)0x0) || (_Var2 = (*filter)(tree,aux), !_Var2)) goto LAB_00104376;
  __ptr = (nbt_node *)malloc(0x20);
  if (__ptr == (nbt_node *)0x0) {
    *piVar3 = -2;
    goto LAB_0010436e;
  }
  __ptr->type = tree->type;
  __ptr_00 = safe_strdup(tree->name);
  __ptr->name = __ptr_00;
  if ((__ptr_00 == (char *)0x0) && (tree->name != (char *)0x0)) goto LAB_001042dc;
  switch(tree->type) {
  case TAG_BYTE_ARRAY:
    __size = (size_t)(tree->payload).tag_byte_array.length;
    __n = __size;
    break;
  case TAG_STRING:
    pnVar4 = (nbt_list *)_nbt_strdup((tree->payload).tag_string);
    goto LAB_00104393;
  case TAG_LIST:
  case TAG_COMPOUND:
    pnVar4 = filter_list((tree->payload).tag_list,filter,aux);
LAB_00104393:
    (__ptr->payload).tag_list = pnVar4;
    if (pnVar4 != (nbt_list *)0x0) {
      return __ptr;
    }
LAB_001042dc:
    if (*piVar3 == 0) goto LAB_0010435f;
    goto LAB_00104366;
  case TAG_INT_ARRAY:
    __n = (size_t)(tree->payload).tag_byte_array.length;
    __size = __n * 4;
    break;
  default:
    uVar1 = *(undefined8 *)((long)&tree->payload + 8);
    (__ptr->payload).tag_long = (tree->payload).tag_long;
    *(undefined8 *)((long)&__ptr->payload + 8) = uVar1;
    return __ptr;
  }
  __dest = (uchar *)malloc(__size);
  (__ptr->payload).tag_byte_array.data = __dest;
  if (__dest == (uchar *)0x0) {
LAB_0010435f:
    *piVar3 = -2;
LAB_00104366:
    free(__ptr_00);
LAB_0010436e:
    free(__ptr);
LAB_00104376:
    __ptr = (nbt_node *)0x0;
  }
  else {
    memcpy(__dest,(tree->payload).tag_byte_array.data,__n);
    (__ptr->payload).tag_byte_array.length = (int32_t)__n;
  }
  return __ptr;
}

Assistant:

nbt_node* nbt_filter(const nbt_node* tree, nbt_predicate_t filter, void* aux)
{
    assert(filter);

    errno = NBT_OK;

    if(tree == NULL)       return NULL;
    if(!filter(tree, aux)) return NULL;

    nbt_node* ret = NULL;
    CHECKED_MALLOC(ret, sizeof *ret, goto filter_error);

    ret->type = tree->type;
    ret->name = safe_strdup(tree->name);

    if(tree->name && ret->name == NULL) goto filter_error;

    if(tree->type == TAG_STRING)
    {
        ret->payload.tag_string = _nbt_strdup(tree->payload.tag_string);
        if(ret->payload.tag_string == NULL) goto filter_error;
    }

    else if(tree->type == TAG_BYTE_ARRAY)
    {
        CHECKED_MALLOC(ret->payload.tag_byte_array.data,
                       tree->payload.tag_byte_array.length,
                       goto filter_error);

        memcpy(ret->payload.tag_byte_array.data,
               tree->payload.tag_byte_array.data,
               tree->payload.tag_byte_array.length);

        ret->payload.tag_byte_array.length = tree->payload.tag_byte_array.length;
    }

    else if(tree->type == TAG_INT_ARRAY)
    {
        CHECKED_MALLOC(ret->payload.tag_int_array.data,
                       tree->payload.tag_int_array.length * sizeof(int32_t),
                       goto filter_error);

        memcpy(ret->payload.tag_int_array.data,
               tree->payload.tag_int_array.data,
               tree->payload.tag_int_array.length);

        ret->payload.tag_int_array.length = tree->payload.tag_int_array.length;
    }

    /* Okay, we want to keep this node, but keep traversing the tree! */
    else if(tree->type == TAG_LIST)
    {
        ret->payload.tag_list = filter_list(tree->payload.tag_list, filter, aux);
        if(ret->payload.tag_list == NULL) goto filter_error;
    }
    else if(tree->type == TAG_COMPOUND)
    {
        ret->payload.tag_compound = filter_list(tree->payload.tag_compound, filter, aux);
        if(ret->payload.tag_compound == NULL) goto filter_error;
    }
    else
    {
        ret->payload = tree->payload;
    }

    return ret;

filter_error:
    if(errno == NBT_OK)
        errno = NBT_EMEM;

    if(ret) free(ret->name);

    free(ret);
    return NULL;
}